

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::relative_pose::modules::ge_main
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  SrcEvaluatorType srcEvaluator;
  void *pvVar1;
  undefined8 *puVar2;
  double *pdVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  double dVar8;
  undefined1 auVar9 [32];
  Vector4d D;
  cayley_t cayley;
  Matrix4d V;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  Matrix4d G;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  FVectorType local_9b0;
  Matrix3d *local_9a0;
  Matrix3d *local_998;
  double local_990;
  double dStack_988;
  double local_980;
  double dStack_978;
  double local_970;
  double dStack_968;
  double local_960;
  double dStack_958;
  double local_950;
  double local_940 [4];
  cayley_t local_920;
  double local_900;
  double dStack_8f8;
  double dStack_8f0;
  double dStack_8e8;
  double dStack_8e0;
  double dStack_8d8;
  double dStack_8d0;
  double dStack_8c8;
  double local_8c0;
  double dStack_8b8;
  double dStack_8b0;
  double dStack_8a8;
  double dStack_8a0;
  double dStack_898;
  double dStack_890;
  double dStack_888;
  double local_880 [8];
  Matrix4d local_840;
  undefined1 local_7c0 [48];
  undefined1 auStack_790 [24];
  undefined1 auStack_778 [24];
  undefined1 auStack_760 [40];
  Index local_738;
  undefined1 uStack_730;
  undefined7 uStack_72f;
  undefined1 uStack_728;
  undefined7 uStack_727;
  undefined1 uStack_720;
  undefined7 uStack_71f;
  undefined1 uStack_718;
  undefined8 uStack_717;
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> *local_708;
  undefined1 local_6f0 [64];
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> local_648;
  undefined8 local_5c0;
  undefined1 local_4c0 [128];
  double local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined2 local_400;
  bool local_1c0;
  undefined2 local_17c;
  Index local_178;
  
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_9a0 = zxF;
  pvVar1 = malloc(0x58);
  if (pvVar1 == (void *)0x0) {
    pdVar3 = (double *)0x0;
  }
  else {
    *(void **)(((ulong)pvVar1 & 0xffffffffffffffc0) + 0x38) = pvVar1;
    pdVar3 = (double *)(((ulong)pvVar1 & 0xffffffffffffffc0) + 0x40);
  }
  if (pdVar3 != (double *)0x0) {
    local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
    lVar4 = 0;
    do {
      pdVar3[lVar4] =
           (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_708 = &local_648;
    local_648.super_Ge_step.super_OptimizationFunctor<double,__1,__1>.m_inputs = 3;
    local_648.super_Ge_step.super_OptimizationFunctor<double,__1,__1>.m_values = 3;
    local_7c0._0_8_ = 100.0;
    local_648.super_Ge_step._zxF = local_9a0;
    local_648.super_Ge_step._x1P = x1P;
    local_648.super_Ge_step._y1P = y1P;
    local_648.super_Ge_step._z1P = z1P;
    local_648.super_Ge_step._x2P = x2P;
    local_648.super_Ge_step._y2P = y2P;
    local_648.super_Ge_step._z2P = z2P;
    local_648.super_Ge_step._m11P = m11P;
    local_648.super_Ge_step._m12P = m12P;
    local_648.super_Ge_step._m22P = m22P;
    local_648.epsfcn = 0.0;
    local_6f0 = ZEXT864(0) << 0x20;
    auStack_790 = (undefined1  [24])0x0;
    auStack_778 = local_6f0._0_24_;
    auStack_760 = (undefined1  [40])0x0;
    local_738 = 0;
    uStack_730 = 0;
    uStack_72f = 0;
    uStack_728 = 0;
    uStack_727 = 0;
    uStack_720 = 0;
    uStack_71f = 0;
    uStack_718 = 0;
    uStack_717 = 0;
    local_7c0._44_4_ = 0;
    local_7c0._32_12_ = ZEXT812(0);
    local_7c0._32_16_ = local_7c0._32_16_ << 0x20;
    local_7c0._16_8_ = 1e-06;
    local_7c0._24_8_ = 2.220446049250313e-15;
    local_7c0._8_8_ = 100;
    local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar3;
    local_998 = xxF;
    local_648.super_Ge_step._xxF = xxF;
    local_648.super_Ge_step._yyF = yyF;
    local_648.super_Ge_step._zzF = zzF;
    local_648.super_Ge_step._xyF = xyF;
    local_648.super_Ge_step._yzF = yzF;
    Eigen::
    LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
    ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
                *)local_7c0,&local_9b0);
    local_920.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
    local_920.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [1];
    local_920.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [2];
    math::cayley2rot(&local_920);
    ge::composeG(&local_840,local_998,yyF,zzF,xyF,yzF,local_9a0,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,
                 m22P,&local_920);
    local_1c0 = false;
    local_17c._0_1_ = false;
    local_17c._1_1_ = false;
    local_440 = 0.0;
    uStack_438 = 0;
    uStack_430 = 0;
    uStack_428 = 0;
    uStack_420 = 0;
    uStack_418 = 0;
    uStack_410 = 0;
    uStack_408 = 0;
    local_400._0_1_ = false;
    local_400._1_1_ = false;
    local_178 = -1;
    Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::compute<Eigen::Matrix<double,4,4,0,4,4>>
              ((EigenSolver<Eigen::Matrix<double,4,4,0,4,4>> *)local_4c0,
               (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_840,true);
    local_880[0] = local_440;
    local_880[1] = (double)uStack_438;
    local_880[2] = (double)uStack_430;
    local_880[3] = (double)uStack_428;
    local_880[4] = (double)uStack_420;
    local_880[5] = (double)uStack_418;
    local_880[6] = (double)uStack_410;
    local_880[7] = (double)uStack_408;
    Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors
              ((EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_4c0);
    auVar5 = vpbroadcastq_avx512vl();
    auVar5 = vpaddq_avx2(auVar5,_DAT_00259320);
    auVar6 = vpbroadcastq_avx512vl();
    auVar6 = vpaddq_avx2(auVar6,_DAT_00259340);
    pdVar3 = local_880;
    lVar4 = 0;
    do {
      local_940[lVar4] = *pdVar3;
      auVar7 = vpbroadcastq_avx512vl();
      auVar9 = vpsllq_avx2(auVar7,4);
      vpaddq_avx2(auVar5,auVar9);
      auVar9 = vgatherqpd_avx512vl(local_5c0);
      auVar7 = vpsllq_avx2(auVar7,3);
      auVar7 = vpaddq_avx2(auVar6,auVar7);
      vscatterqpd_avx512vl(ZEXT832(0) + auVar7,0xffff,auVar9);
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + 2;
    } while (lVar4 != 4);
    dVar8 = 1.0 / dStack_8e8;
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = dVar8 * local_900;
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = dVar8 * dStack_8f8;
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] = dVar8 * dStack_8f0;
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = dVar8 * dStack_8e8;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[0] = local_990;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[1] = dStack_988;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[2] = local_980;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[3] = dStack_978;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[4] = local_970;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[5] = dStack_968;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[6] = local_960;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[7] = dStack_958;
    (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
    .array[8] = local_950;
    (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = local_940[0];
    (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = local_940[1];
    (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] = local_940[2];
    (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = local_940[3];
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[0] = local_900;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[1] = dStack_8f8;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[2] = dStack_8f0;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[3] = dStack_8e8;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[4] = dStack_8e0;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[5] = dStack_8d8;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[6] = dStack_8d0;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[7] = dStack_8c8;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[8] = local_8c0;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[9] = dStack_8b8;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[10] = dStack_8b0;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[0xb] = dStack_8a8;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[0xc] = dStack_8a0;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[0xd] = dStack_898;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[0xe] = dStack_890;
    (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
    m_data.array[0xf] = dStack_888;
    Eigen::
    LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
    ::~LevenbergMarquardt
              ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
                *)local_7c0);
    if (local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_9b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[-1]);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = acos;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void
opengv::relative_pose::modules::ge_main(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //this one doesn't work, probably because of double numerical differentiation
  //use ge_main2, which is an implementation of gradient descent
  const int n=3;
  VectorXd x(n);

  x = startingPoint;
  Ge_step functor(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P);
  NumericalDiff<Ge_step> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<Ge_step> > lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 0.000001;//1.E1*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 100;
  lm.minimize(x);

  cayley_t cayley = x;
  rotation_t R = math::cayley2rot(cayley);
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = R;
  output.eigenvalues = D;
  output.eigenvectors = V;
}